

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

bool __thiscall
JsUtil::
ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
::Contains(ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
           *this,void **item)

{
  BOOL BVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = 0 < this->count;
  if ((0 < this->count) &&
     (BVar1 = Js::JavascriptOperators::StrictEqual
                        (*item,*this->buffer,
                         *(ScriptContext **)(*(long *)(*(long *)((long)*item + 8) + 8) + 0x490)),
     BVar1 != 1)) {
    lVar2 = 1;
    do {
      bVar3 = lVar2 < this->count;
      if (this->count <= lVar2) {
        return bVar3;
      }
      BVar1 = Js::JavascriptOperators::StrictEqual
                        (*item,this->buffer[lVar2],
                         *(ScriptContext **)(*(long *)(*(long *)((long)*item + 8) + 8) + 0x490));
      lVar2 = lVar2 + 1;
    } while (BVar1 != 1);
  }
  return bVar3;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }